

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

void dlmalloc_stats(void)

{
  mchunkptr pmVar1;
  malloc_segment *pmVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  mchunkptr pmVar7;
  ulong uVar8;
  size_t sVar9;
  bool bVar10;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (((byte)_gm_.mflags & 2) != 0) {
    LOCK();
    UNLOCK();
    bVar10 = _gm_.mutex != 0;
    _gm_.mutex = 1;
    if (bVar10) {
      spin_acquire_lock(&_gm_.mutex);
    }
  }
  if (_gm_.top == (mchunkptr)0x0) {
    lVar4 = 0;
    sVar3 = 0;
    sVar9 = 0;
  }
  else {
    lVar4 = (_gm_.footprint - _gm_.topsize) + -0x50;
    for (pmVar2 = &_gm_.seg; sVar3 = _gm_.max_footprint, sVar9 = _gm_.footprint,
        pmVar2 != (malloc_segment *)0x0; pmVar2 = pmVar2->next) {
      pmVar1 = (mchunkptr)pmVar2->base;
      uVar5 = (int)pmVar1 + 0x10;
      uVar6 = (ulong)(-uVar5 & 0xf);
      if ((uVar5 & 0xf) == 0) {
        uVar6 = 0;
      }
      for (pmVar7 = (mchunkptr)((long)&pmVar1->prev_foot + uVar6);
          (((pmVar1 <= pmVar7 && (pmVar7 != _gm_.top)) &&
           (pmVar7 < (mchunkptr)((long)&pmVar1->prev_foot + pmVar2->size))) &&
          (uVar6 = pmVar7->head, uVar6 != 0xb));
          pmVar7 = (mchunkptr)((long)&pmVar7->prev_foot + (uVar6 & 0xfffffffffffffff8))) {
        uVar8 = 0;
        if (((uint)uVar6 & 3) == 1) {
          uVar8 = uVar6 & 0xfffffffffffffff8;
        }
        lVar4 = lVar4 - uVar8;
      }
    }
  }
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  fprintf((FILE *)stderr,"max system bytes = %10lu\n",sVar3);
  fprintf((FILE *)stderr,"system bytes     = %10lu\n",sVar9);
  fprintf((FILE *)stderr,"in use bytes     = %10lu\n",lVar4);
  return;
}

Assistant:

static void internal_malloc_stats(mstate m) {
  ensure_initialization();
  if (!PREACTION(m)) {
    size_t maxfp = 0;
    size_t fp = 0;
    size_t used = 0;
    check_malloc_state(m);
    if (is_initialized(m)) {
      msegmentptr s = &m->seg;
      maxfp = m->max_footprint;
      fp = m->footprint;
      used = fp - (m->topsize + TOP_FOOT_SIZE);

      while (s != 0) {
        mchunkptr q = align_as_chunk(s->base);
        while (segment_holds(s, q) &&
               q != m->top && q->head != FENCEPOST_HEAD) {
          if (!is_inuse(q))
            used -= chunksize(q);
          q = next_chunk(q);
        }
        s = s->next;
      }
    }
    POSTACTION(m); /* drop lock */
    fprintf(stderr, "max system bytes = %10lu\n", (unsigned long)(maxfp));
    fprintf(stderr, "system bytes     = %10lu\n", (unsigned long)(fp));
    fprintf(stderr, "in use bytes     = %10lu\n", (unsigned long)(used));
  }
}